

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

size_t __thiscall diy::FileStorage::max_size(FileStorage *this)

{
  unsigned_long *puVar1;
  critical_resource<unsigned_long,_tthread::fast_mutex> *in_stack_ffffffffffffffb8;
  unsigned_long uVar2;
  resource_accessor<const_unsigned_long,_tthread::fast_mutex> local_20;
  
  critical_resource<unsigned_long,_tthread::fast_mutex>::const_access(in_stack_ffffffffffffffb8);
  puVar1 = resource_accessor<const_unsigned_long,_tthread::fast_mutex>::operator*(&local_20);
  uVar2 = *puVar1;
  resource_accessor<const_unsigned_long,_tthread::fast_mutex>::~resource_accessor
            ((resource_accessor<const_unsigned_long,_tthread::fast_mutex> *)0x11af88);
  return uVar2;
}

Assistant:

size_t        max_size() const            { return (*max_size_.const_access()); }